

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O1

vector<State,_std::allocator<State>_> * __thiscall
Problem::fringeExpander
          (vector<State,_std::allocator<State>_> *__return_storage_ptr__,Problem *this,
          vector<State,_std::allocator<State>_> *fringe,int fringeSize,int expanderCode)

{
  vector<State,_std::allocator<State>_> *pvVar1;
  bool bVar2;
  vector<State,_std::allocator<State>_> *this_00;
  pointer pSVar3;
  vector<State,_std::allocator<State>_> newfringe;
  vector<State,_std::allocator<State>_> *expandedfringe;
  vector<State,_std::allocator<State>_> neighbours;
  vector<State,_std::allocator<State>_> local_e8;
  vector<State,_std::allocator<State>_> *local_d0;
  State local_c8;
  vector<State,_std::allocator<State>_> local_a0;
  vector<State,_std::allocator<State>_> local_88;
  vector<State,_std::allocator<State>_> local_70;
  State local_58;
  
  local_d0 = __return_storage_ptr__;
  std::vector<State,_std::allocator<State>_>::vector(&local_e8,fringe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Expanding fringe",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  pSVar3 = (fringe->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar3 < (fringe->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
               super__Vector_impl_data._M_finish) {
    do {
      std::vector<int,_std::allocator<int>_>::vector(&local_58.bidNumbers,&pSVar3->bidNumbers);
      local_58.numConflicts = pSVar3->numConflicts;
      local_58.cost = pSVar3->cost;
      getNeighbours((vector<State,_std::allocator<State>_> *)&local_c8,this,&local_58);
      if (local_58.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::vector<State,std::allocator<State>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<State*,std::vector<State,std::allocator<State>>>>
                ((vector<State,std::allocator<State>> *)&local_e8,
                 local_e8.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 local_c8.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_c8.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::vector<State,_std::allocator<State>_>::~vector
                ((vector<State,_std::allocator<State>_> *)&local_c8);
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 < (fringe->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
                      super__Vector_impl_data._M_finish);
  }
  pvVar1 = local_d0;
  if (local_e8.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
      _M_start <
      local_e8.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pSVar3 = local_e8.super__Vector_base<State,_std::allocator<State>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      std::vector<int,_std::allocator<int>_>::vector(&local_c8.bidNumbers,&pSVar3->bidNumbers);
      local_c8.numConflicts = pSVar3->numConflicts;
      local_c8.cost = pSVar3->cost;
      bVar2 = State::isValid(&local_c8);
      if (bVar2) {
        std::priority_queue<State,_std::vector<State,_std::allocator<State>_>,_CompareState>::push
                  (&this->validStateStore,&local_c8);
      }
      if (local_c8.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 < local_e8.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  }
  (pvVar1->super__Vector_base<State,_std::allocator<State>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pvVar1->super__Vector_base<State,_std::allocator<State>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pvVar1->super__Vector_base<State,_std::allocator<State>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (expanderCode == 0) {
    std::vector<State,_std::allocator<State>_>::vector(&local_88,&local_e8);
    localGreedyExpander(&local_70,this,&local_88,fringeSize);
    local_c8.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(pvVar1->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    local_c8.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(pvVar1->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
    local_c8.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(pvVar1->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    (pvVar1->super__Vector_base<State,_std::allocator<State>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_70.super__Vector_base<State,_std::allocator<State>_>._M_impl.
               super__Vector_impl_data._M_start;
    (pvVar1->super__Vector_base<State,_std::allocator<State>_>)._M_impl.super__Vector_impl_data.
    _M_finish = local_70.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (pvVar1->super__Vector_base<State,_std::allocator<State>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_70.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_70.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_70.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_70.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<State,_std::allocator<State>_>::~vector
              ((vector<State,_std::allocator<State>_> *)&local_c8);
    std::vector<State,_std::allocator<State>_>::~vector(&local_70);
    this_00 = &local_88;
  }
  else {
    std::vector<State,_std::allocator<State>_>::vector(&local_a0,&local_e8);
    localGreedyExpander(&local_70,this,&local_a0,fringeSize);
    local_c8.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(pvVar1->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    local_c8.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(pvVar1->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
    local_c8.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(pvVar1->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    (pvVar1->super__Vector_base<State,_std::allocator<State>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_70.super__Vector_base<State,_std::allocator<State>_>._M_impl.
               super__Vector_impl_data._M_start;
    (pvVar1->super__Vector_base<State,_std::allocator<State>_>)._M_impl.super__Vector_impl_data.
    _M_finish = local_70.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (pvVar1->super__Vector_base<State,_std::allocator<State>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_70.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_70.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_70.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_70.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<State,_std::allocator<State>_>::~vector
              ((vector<State,_std::allocator<State>_> *)&local_c8);
    std::vector<State,_std::allocator<State>_>::~vector(&local_70);
    this_00 = &local_a0;
  }
  std::vector<State,_std::allocator<State>_>::~vector(this_00);
  std::vector<State,_std::allocator<State>_>::~vector(&local_e8);
  return pvVar1;
}

Assistant:

vector<State> Problem::fringeExpander(vector<State> fringe, int fringeSize, int expanderCode) {
    // Initialize new fringe with old fringe
    vector<State> newfringe(fringe);
    cout<<"Expanding fringe"<<endl;

    // TODO: improve method to form new fringe without using enormous space each time
    // Algorithm has much less running time for fringeSize=1 -> Re-implement
    for (auto it = fringe.begin(); it < fringe.end(); it++) {
        vector<State> neighbours = getNeighbours(*it);
        newfringe.insert(newfringe.end(), neighbours.begin(), neighbours.end());
    }

    // Update validStateStore if valid state found among neighbours
    for (auto it = newfringe.begin(); it < newfringe.end(); it++) {
        State state = *it;
        if (state.isValid()) {
            validStateStore.push(state);
        }
        if (validStateStore.size() > validStoreSize) {
            // validStateStore.pop();                  //Question: Won't this remove the best states???????
        }
    }

    // Carry out operation according to expanderCode
    /*
     * Codes for expander functions
     * 0 : greedy expander
     */
    vector<State> expandedfringe;
    switch (expanderCode) {
        case 0:
            expandedfringe = localGreedyExpander(newfringe, fringeSize);
            break;

        default:
            expandedfringe = localGreedyExpander(newfringe, fringeSize);
            break;
    }

    return expandedfringe;
}